

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

VarName * __thiscall Parser::parseVarName(Parser *this)

{
  pointer pcVar1;
  pointer pTVar2;
  FILE *__stream;
  uint uVar3;
  string *psVar4;
  VarName *this_00;
  pointer pTVar6;
  TokenType type;
  ulong uVar7;
  string temp;
  string local_60;
  string local_40;
  ulong uVar5;
  
  psVar4 = Token::getValue_abi_cxx11_(this->currentToken);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + psVar4->_M_string_length);
  __stream = _stdout;
  Token::tokenDesc_abi_cxx11_(&local_40,(Token *)0x10,type);
  fprintf(__stream,"\x1b[32m\tParsing [%s] \'%s\'\n\x1b[0m",local_40._M_dataplus._M_p,
          local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  uVar3 = this->curTokenPos + 1;
  uVar5 = (ulong)uVar3;
  this->curTokenPos = uVar3;
  pTVar2 = (this->tokenList).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->tokenList).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar2 >> 4) * -0x5555555555555555;
  pTVar6 = (pointer)0x0;
  if (uVar5 <= uVar7 && uVar7 - uVar5 != 0) {
    pTVar6 = pTVar2 + uVar5;
  }
  this->currentToken = pTVar6;
  this_00 = (VarName *)operator_new(0x28);
  VarName::VarName(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

VarName *Parser::parseVarName() {
    // Store temp value
    std::string temp = currentToken->getValue();

    // Debug output
    if (_VERBOSITY >= 3) {
        fprintf(stdout, ANSI_COLOR_GREEN "\tParsing [%s] \'%s\'\n" ANSI_COLOR_RESET,
                Token::tokenDesc(TokenType::VarToken).data(), temp.data());
    }

    // Prep next token
    loadNextToken();

    return new VarName(temp);
}